

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O2

int Cec_ManSeqSemiformal(Gia_Man_t *pAig,Cec_ParSmf_t *pPars)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Vec_Ptr_t *vInfo;
  Vec_Str_t *__ptr;
  Gia_Man_t *pInit;
  int iVar4;
  Abc_Cex_t *pAVar5;
  char *pcVar6;
  int nPats;
  int nFramesReal;
  Abc_Cex_t *local_68;
  int local_5c;
  int local_58;
  Cec_ParSat_t ParsSat;
  
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    pcVar6 = "Cec_ManSeqSemiformal(): Equivalence classes are not available.\n";
  }
  else {
    if (pAig->nRegs != 0) {
      Gia_ManRandom(1);
      local_68 = Abc_CexAlloc(pAig->nRegs,0,0);
      local_68->iPo = -1;
      local_68->iFrame = -1;
      Cec_ManSatSetDefaultParams(&ParsSat);
      ParsSat.nBTLimit = pPars->nBTLimit;
      ParsSat.fVerbose = pPars->fVerbose;
      if (ParsSat.fVerbose != 0) {
        Abc_Print(1,"Starting: ");
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      Gia_ManCleanMark0(pAig);
      iVar1 = 0;
      iVar4 = 0;
      while (pAVar5 = local_68,
            pcVar6 = 
            "Cec_ManSeqSemiformal: There are only trivial equiv candidates left (PO drivers). Quitting.\n"
            , iVar4 < pPars->nRounds) {
        local_5c = iVar1;
        local_58 = iVar4;
        iVar1 = Cec_ManCheckNonTrivialCands(pAig);
        iVar4 = 0;
        if (iVar1 == 0) {
LAB_00529afd:
          Abc_Print(1,pcVar6);
          goto LAB_00529b0a;
        }
        pGVar3 = Gia_ManSpecReduceInitFrames
                           (pAig,pAVar5,pPars->nFrames,&nFramesReal,pPars->fDualOut,
                            pPars->nMinOutputs);
        if (pGVar3 == (Gia_Man_t *)0x0) {
          pcVar6 = "Quitting refinement because miter could not be unrolled.\n";
          goto LAB_00529afd;
        }
        if (pGVar3->nRegs != 0) {
LAB_00529b49:
          __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManPiNum(pSrm) == (Gia_ManPiNum(pAig) * nFramesReal)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                        ,0x17d,"int Cec_ManSeqSemiformal(Gia_Man_t *, Cec_ParSmf_t *)");
        }
        iVar1 = pAig->nRegs;
        iVar4 = pAig->vCis->nSize - iVar1;
        if (pGVar3->vCis->nSize != iVar4 * nFramesReal) goto LAB_00529b49;
        if (pPars->fVerbose != 0) {
          Abc_Print(1,"Unrolled for %d frames.\n");
          iVar1 = pAig->nRegs;
          iVar4 = pAig->vCis->nSize - iVar1;
        }
        vInfo = Vec_PtrAllocSimInfo((nFramesReal + 0x10) * iVar4 + iVar1,pPars->nWords);
        pAVar5 = local_68;
        Cec_ManSeqDeriveInfoInitRandom(vInfo,pAig,local_68);
        __ptr = Cec_ManSatSolveSeq(vInfo,pGVar3,&ParsSat,pAig->nRegs,&nPats);
        free(__ptr->pArray);
        free(__ptr);
        Gia_ManStop(pGVar3);
        iVar1 = Cec_ManSeqResimulateInfo(pAig,vInfo,pAVar5,pPars->fCheckMiter);
        Vec_PtrFree(vInfo);
        if (pAVar5->iPo < 0) {
          __assert_fail("pState->iPo >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                        ,0x18b,"int Cec_ManSeqSemiformal(Gia_Man_t *, Cec_ParSmf_t *)");
        }
        pAVar5->iPo = -1;
        if (pPars->fVerbose != 0) {
          Abc_Print(1,"BMC = %3d ",(ulong)(uint)nPats);
          Gia_ManEquivPrintClasses(pAig,0,0.0);
        }
        Gia_AigerWrite(pAig,"gore.aig",0,0,0);
        pGVar3 = Gia_ManSpecReduce(pAig,0,0,1,0,0);
        if (pGVar3 != (Gia_Man_t *)0x0) {
          pInit = Gia_ManSeqStructSweep(pGVar3,1,1,0);
          Gia_ManStop(pGVar3);
          Gia_AigerWrite(pInit,"gsrm.aig",0,0,0);
          Gia_ManStop(pInit);
        }
        iVar4 = 1;
        if (iVar1 != 0) {
          pcVar6 = 
          "Cec_ManSeqSemiformal(): An output of the miter is asserted. Refinement stopped.\n";
          pAVar5 = local_68;
          goto LAB_00529afd;
        }
        iVar1 = 0;
        if ((nPats < 1) && (iVar1 = local_5c + 1, iVar1 == pPars->nNonRefines)) break;
        iVar4 = local_58 + 1;
      }
      iVar4 = 0;
      pAVar5 = local_68;
LAB_00529b0a:
      free(pAVar5);
      if (pPars->fCheckMiter == 0) {
        return iVar4;
      }
      uVar2 = Cec_ManCountNonConstOutputs(pAig);
      if (uVar2 == 0) {
        return iVar4;
      }
      Abc_Print(1,"The number of POs that are not const-0 candidates = %d.\n",(ulong)uVar2);
      return iVar4;
    }
    pcVar6 = "Cec_ManSeqSemiformal(): Not a sequential AIG.\n";
  }
  Abc_Print(1,pcVar6);
  return -1;
}

Assistant:

int Cec_ManSeqSemiformal( Gia_Man_t * pAig, Cec_ParSmf_t * pPars )
{ 
    int nAddFrames = 16; // additional timeframes to simulate
    int nCountNoRef = 0;
    int nFramesReal;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Vec_Ptr_t * vSimInfo; 
    Vec_Str_t * vStatus;
    Abc_Cex_t * pState;
    Gia_Man_t * pSrm, * pReduce, * pAux;
    int r, nPats, RetValue = 0;
    if ( pAig->pReprs == NULL )
    { 
        Abc_Print( 1, "Cec_ManSeqSemiformal(): Equivalence classes are not available.\n" );
        return -1;
    }
    if ( Gia_ManRegNum(pAig) == 0 )
    {
        Abc_Print( 1, "Cec_ManSeqSemiformal(): Not a sequential AIG.\n" );
        return -1;
    }
    Gia_ManRandom( 1 );
    // prepare starting pattern
    pState = Abc_CexAlloc( Gia_ManRegNum(pAig), 0, 0 );
    pState->iFrame = -1;
    pState->iPo = -1;
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pParsSat->fVerbose )
    {
        Abc_Print( 1, "Starting: " );
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    }
    // perform the given number of BMC rounds
    Gia_ManCleanMark0( pAig );
    for ( r = 0; r < pPars->nRounds; r++ )
    {
        if ( !Cec_ManCheckNonTrivialCands(pAig) )
        {
            Abc_Print( 1, "Cec_ManSeqSemiformal: There are only trivial equiv candidates left (PO drivers). Quitting.\n" );
            break;
        }
//        Abc_CexPrint( pState );
        // derive speculatively reduced model
//        pSrm = Gia_ManSpecReduceInit( pAig, pState, pPars->nFrames, pPars->fDualOut );
        pSrm = Gia_ManSpecReduceInitFrames( pAig, pState, pPars->nFrames, &nFramesReal, pPars->fDualOut, pPars->nMinOutputs );
        if ( pSrm == NULL )
        {
            Abc_Print( 1, "Quitting refinement because miter could not be unrolled.\n" );
            break;
        }
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManPiNum(pSrm) == (Gia_ManPiNum(pAig) * nFramesReal) );
        if ( pPars->fVerbose )
            Abc_Print( 1, "Unrolled for %d frames.\n", nFramesReal );
        // allocate room for simulation info
        vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pAig) + 
            Gia_ManPiNum(pAig) * (nFramesReal + nAddFrames), pPars->nWords );
        Cec_ManSeqDeriveInfoInitRandom( vSimInfo, pAig, pState );
        // fill in simulation info with counter-examples
        vStatus = Cec_ManSatSolveSeq( vSimInfo, pSrm, pParsSat, Gia_ManRegNum(pAig), &nPats );
        Vec_StrFree( vStatus );
        Gia_ManStop( pSrm );
        // resimulate and refine the classes
        RetValue = Cec_ManSeqResimulateInfo( pAig, vSimInfo, pState, pPars->fCheckMiter );
        Vec_PtrFree( vSimInfo );
        assert( pState->iPo >= 0 ); // hit counter
        pState->iPo = -1;
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "BMC = %3d ", nPats );
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        }

        // write equivalence classes
        Gia_AigerWrite( pAig, "gore.aig", 0, 0, 0 );
        // reduce the model
        pReduce = Gia_ManSpecReduce( pAig, 0, 0, 1, 0, 0 );
        if ( pReduce )
        {
            pReduce = Gia_ManSeqStructSweep( pAux = pReduce, 1, 1, 0 );
            Gia_ManStop( pAux );
            Gia_AigerWrite( pReduce, "gsrm.aig", 0, 0, 0 );
//            Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", "gsrm.aig" );
//          Gia_ManPrintStatsShort( pReduce );
            Gia_ManStop( pReduce );
        }

        if ( RetValue )
        {
            Abc_Print( 1, "Cec_ManSeqSemiformal(): An output of the miter is asserted. Refinement stopped.\n" );
            break;
        }
        // decide when to stop
        if ( nPats > 0 )
            nCountNoRef = 0;
        else if ( ++nCountNoRef == pPars->nNonRefines )
            break;
    }
    ABC_FREE( pState );
    if ( pPars->fCheckMiter )
    {
        int nNonConsts = Cec_ManCountNonConstOutputs( pAig );
        if ( nNonConsts )
            Abc_Print( 1, "The number of POs that are not const-0 candidates = %d.\n", nNonConsts );
    }
    return RetValue;
}